

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O2

void __thiscall Assimp::XGLImporter::ReadMaterial(XGLImporter *this,TempScope *scope)

{
  TempScope *pTVar1;
  bool bVar2;
  aiMaterial *this_00;
  mapped_type *ppaVar3;
  uint mat_id;
  TempScope *local_70;
  aiMaterial *mat;
  aiColor3D c;
  string local_50;
  
  local_70 = scope;
  mat_id = ReadIDAttr(this);
  this_00 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(this_00);
  mat = this_00;
  while( true ) {
    bVar2 = ReadElementUpToClosing(this,"mat");
    pTVar1 = local_70;
    if (!bVar2) break;
    GetElementName_abi_cxx11_(&local_50,this);
    bVar2 = std::operator==(&local_50,"amb");
    if (bVar2) {
      ReadCol3((XGLImporter *)&c);
      aiMaterial::AddProperty(this_00,&c,1,"$clr.ambient",0,0);
    }
    else {
      bVar2 = std::operator==(&local_50,"diff");
      if (bVar2) {
        ReadCol3((XGLImporter *)&c);
        aiMaterial::AddProperty(this_00,&c,1,"$clr.diffuse",0,0);
      }
      else {
        bVar2 = std::operator==(&local_50,"spec");
        if (bVar2) {
          ReadCol3((XGLImporter *)&c);
          aiMaterial::AddProperty(this_00,&c,1,"$clr.specular",0,0);
        }
        else {
          bVar2 = std::operator==(&local_50,"emiss");
          if (bVar2) {
            ReadCol3((XGLImporter *)&c);
            aiMaterial::AddProperty(this_00,&c,1,"$clr.emissive",0,0);
          }
          else {
            bVar2 = std::operator==(&local_50,"alpha");
            if (bVar2) {
              c.r = ReadFloat(this);
              aiMaterial::AddProperty(this_00,(float *)&c,1,"$mat.opacity",0,0);
            }
            else {
              bVar2 = std::operator==(&local_50,"shine");
              if (bVar2) {
                c.r = ReadFloat(this);
                aiMaterial::AddProperty(this_00,(float *)&c,1,"$mat.shininess",0,0);
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&local_50);
  }
  ppaVar3 = std::
            map<unsigned_int,_aiMaterial_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiMaterial_*>_>_>
            ::operator[](&local_70->materials,&mat_id);
  *ppaVar3 = this_00;
  std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::push_back
            (&pTVar1->materials_linear,&mat);
  return;
}

Assistant:

void XGLImporter::ReadMaterial(TempScope& scope) {
    const unsigned int mat_id = ReadIDAttr();

    aiMaterial *mat(new aiMaterial );
    while (ReadElementUpToClosing("mat"))  {
        const std::string& s = GetElementName();
        if (s == "amb") {
            const aiColor3D c = ReadCol3();
            mat->AddProperty(&c,1,AI_MATKEY_COLOR_AMBIENT);
        }
        else if (s == "diff") {
            const aiColor3D c = ReadCol3();
            mat->AddProperty(&c,1,AI_MATKEY_COLOR_DIFFUSE);
        }
        else if (s == "spec") {
            const aiColor3D c = ReadCol3();
            mat->AddProperty(&c,1,AI_MATKEY_COLOR_SPECULAR);
        }
        else if (s == "emiss") {
            const aiColor3D c = ReadCol3();
            mat->AddProperty(&c,1,AI_MATKEY_COLOR_EMISSIVE);
        }
        else if (s == "alpha") {
            const float f = ReadFloat();
            mat->AddProperty(&f,1,AI_MATKEY_OPACITY);
        }
        else if (s == "shine") {
            const float f = ReadFloat();
            mat->AddProperty(&f,1,AI_MATKEY_SHININESS);
        }
    }

    scope.materials[mat_id] = mat;
    scope.materials_linear.push_back(mat);
}